

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ConcurrentAssertionStatementSyntax::setChild
          (ConcurrentAssertionStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  logic_error *this_00;
  Token TVar3;
  ActionBlockSyntax *local_188;
  PropertySpecSyntax *local_180;
  NamedLabelSyntax *local_178;
  string local_150;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ActionBlockSyntax *local_78;
  ActionBlockSyntax *local_70;
  undefined8 local_68;
  Info *local_60;
  PropertySpecSyntax *local_58;
  PropertySpecSyntax *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  ConcurrentAssertionStatementSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_178 = (NamedLabelSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_178 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar2);
    }
    (this->super_StatementSyntax).label = local_178;
    break;
  case 1:
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_StatementSyntax).attributes,pSVar1);
    break;
  case 2:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar3._0_8_;
    (this->keyword).kind = (undefined2)local_28;
    (this->keyword).field_0x2 = local_28._2_1_;
    (this->keyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->keyword).rawLen = local_28._4_4_;
    local_20 = TVar3.info;
    (this->keyword).info = local_20;
    break;
  case 3:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar3._0_8_;
    (this->propertyOrSequence).kind = (undefined2)local_38;
    (this->propertyOrSequence).field_0x2 = local_38._2_1_;
    (this->propertyOrSequence).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->propertyOrSequence).rawLen = local_38._4_4_;
    local_30 = TVar3.info;
    (this->propertyOrSequence).info = local_30;
    break;
  case 4:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar3._0_8_;
    (this->openParen).kind = (undefined2)local_48;
    (this->openParen).field_0x2 = local_48._2_1_;
    (this->openParen).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->openParen).rawLen = local_48._4_4_;
    local_40 = TVar3.info;
    (this->openParen).info = local_40;
    break;
  case 5:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_180 = (PropertySpecSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_180 = SyntaxNode::as<slang::syntax::PropertySpecSyntax>(pSVar2);
    }
    local_58 = local_180;
    not_null<slang::syntax::PropertySpecSyntax*>::not_null<slang::syntax::PropertySpecSyntax*,void>
              ((not_null<slang::syntax::PropertySpecSyntax*> *)&local_50,&local_58);
    (this->propertySpec).ptr = local_50;
    break;
  case 6:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar3._0_8_;
    (this->closeParen).kind = (undefined2)local_68;
    (this->closeParen).field_0x2 = local_68._2_1_;
    (this->closeParen).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->closeParen).rawLen = local_68._4_4_;
    local_60 = TVar3.info;
    (this->closeParen).info = local_60;
    break;
  case 7:
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      local_188 = (ActionBlockSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      local_188 = SyntaxNode::as<slang::syntax::ActionBlockSyntax>(pSVar2);
    }
    local_78 = local_188;
    not_null<slang::syntax::ActionBlockSyntax*>::not_null<slang::syntax::ActionBlockSyntax*,void>
              ((not_null<slang::syntax::ActionBlockSyntax*> *)&local_70,&local_78);
    (this->action).ptr = local_70;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_119);
    std::operator+(&local_f8,&local_118,":");
    std::__cxx11::to_string(&local_150,0x9cf);
    std::operator+(&local_d8,&local_f8,&local_150);
    std::operator+(&local_b8,&local_d8,": ");
    std::operator+(&local_98,&local_b8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_98);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void ConcurrentAssertionStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: keyword = child.token(); return;
        case 3: propertyOrSequence = child.token(); return;
        case 4: openParen = child.token(); return;
        case 5: propertySpec = child.node() ? &child.node()->as<PropertySpecSyntax>() : nullptr; return;
        case 6: closeParen = child.token(); return;
        case 7: action = child.node() ? &child.node()->as<ActionBlockSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}